

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if.c
# Opt level: O0

int custom_2(uint arg1,char *argx,uint count,char *retBuf,uint32_t retMax)

{
  gpioExtent_t *in_RCX;
  undefined8 in_RSI;
  gpioExtent_t ext [1];
  int bytes;
  int in_stack_00000fb8;
  int in_stack_00000fbc;
  void *in_stack_00000fc0;
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  int in_stack_ffffffffffffffd0;
  int local_28;
  int in_stack_ffffffffffffffe8;
  
  local_28 = pigpio_command_ext(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,
                                in_stack_ffffffffffffffc8,(int)((ulong)in_RSI >> 0x20),(int)in_RSI,0
                                ,in_RCX,in_stack_ffffffffffffffe8);
  if (0 < local_28) {
    local_28 = recvMax(in_stack_00000fc0,in_stack_00000fbc,in_stack_00000fb8);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&command_mutex);
  return local_28;
}

Assistant:

int custom_2(unsigned arg1, char *argx, unsigned count,
             char *retBuf, uint32_t retMax)
{
   int bytes;
   gpioExtent_t ext[1];

   /*
   p1=arg1
   p2=retMax
   p3=count
   ## extension ##
   char argx[count]
   */

   ext[0].size = count;
   ext[0].ptr = argx;

   bytes = pigpio_command_ext
      (gPigCommand, PI_CMD_CF2, arg1, retMax, count, 1, ext, 0);

   if (bytes > 0)
   {
      bytes = recvMax(retBuf, retMax, bytes);
   }

   pthread_mutex_unlock(&command_mutex);

   return bytes;
}